

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocketnotifier.cpp
# Opt level: O2

bool __thiscall QSocketNotifier::event(QSocketNotifier *this,QEvent *e)

{
  quint16 qVar1;
  QObjectData *pQVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QMetaMethodArgument local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->super_QObject).d_ptr.d;
  qVar1 = e->t;
  if ((qVar1 == 0xd3) || (qVar1 == 0x32)) {
    local_38.metaType = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.name = &DAT_aaaaaaaaaaaaaaaa;
    QPointer<QSocketNotifier>::QPointer<void>((QPointer<QSocketNotifier> *)&local_38,this);
    activated(this,(int)pQVar2[1].children.d.size,
              *(undefined4 *)((long)&pQVar2[1].children.d.size + 4));
    bVar3 = QPointer::operator_cast_to_bool((QPointer *)&local_38);
    if (bVar3) {
      activated(this,(int)pQVar2[1].children.d.size);
    }
    QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)&local_38);
    bVar3 = true;
  }
  else {
    if ((qVar1 == 0x16) && (pQVar2[1].field_0x30 == '\x01')) {
      local_38.data = &pQVar2[1].field_0x30;
      local_38.metaType = &QtPrivate::QMetaTypeInterfaceWrapper<bool>::metaType;
      local_38.name = "bool";
      QMetaObject::invokeMethod<QMetaMethodArgument>
                (&this->super_QObject,"setEnabled",QueuedConnection,&local_38);
      setEnabled(this,false);
    }
    bVar3 = QObject::event(&this->super_QObject,e);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QSocketNotifier::event(QEvent *e)
{
    Q_D(QSocketNotifier);
    // Emits the activated() signal when a QEvent::SockAct or QEvent::SockClose is
    // received.
    switch (e->type()) {
    case QEvent::ThreadChange:
        if (d->snenabled) {
            QMetaObject::invokeMethod(this, "setEnabled", Qt::QueuedConnection,
                                      Q_ARG(bool, d->snenabled));
            setEnabled(false);
        }
        break;
    case QEvent::SockAct:
    case QEvent::SockClose:
        {
            QPointer<QSocketNotifier> alive(this);
            emit activated(d->sockfd, d->sntype, QPrivateSignal());
            // ### Qt7: Remove emission if the activated(int) signal is removed
            if (alive)
                emit activated(int(qintptr(d->sockfd)), QPrivateSignal());
        }
        return true;
    default:
        break;
    }
    return QObject::event(e);
}